

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::String::String(String *this,String *other)

{
  undefined8 uVar1;
  char *__dest;
  
  if (-1 < (other->field_0).buf[0x17]) {
    *(undefined8 *)((long)&this->field_0 + 0x10) = *(undefined8 *)((long)&other->field_0 + 0x10);
    uVar1 = *(undefined8 *)((long)&other->field_0 + 8);
    (this->field_0).data.ptr = (other->field_0).data.ptr;
    *(undefined8 *)((long)&this->field_0 + 8) = uVar1;
    return;
  }
  __dest = allocate(this,(other->field_0).data.size);
  memcpy(__dest,(other->field_0).data.ptr,(ulong)(other->field_0).data.size);
  return;
}

Assistant:

String::String(const String& other) { copy(other); }